

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexturecache.cpp
# Opt level: O3

void __thiscall QOpenGLTextureCache::~QOpenGLTextureCache(QOpenGLTextureCache *this)

{
  Data *this_00;
  
  *(undefined ***)this = &PTR__QOpenGLTextureCache_001a1468;
  this_00 = &(this->m_cache).d;
  QHashPrivate::Data<QCache<unsigned_long_long,_QOpenGLCachedTexture>::Node>::clear(this_00);
  (this->m_cache).total = 0;
  (this->m_cache).chain.next = &(this->m_cache).chain;
  (this->m_cache).chain.prev = &(this->m_cache).chain;
  QHashPrivate::Data<QCache<unsigned_long_long,_QOpenGLCachedTexture>::Node>::~Data(this_00);
  if ((this->m_mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p != (__pointer_type)0x0) {
    QBasicMutex::destroyInternal(&this->m_mutex);
  }
  QOpenGLSharedResource::~QOpenGLSharedResource(&this->super_QOpenGLSharedResource);
  return;
}

Assistant:

QOpenGLTextureCache::~QOpenGLTextureCache()
{
}